

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::StateChangeCallPerformanceCase::iterate(StateChangeCallPerformanceCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  size_type sVar3;
  undefined4 extraout_var;
  StateChangeCallPerformanceCase *this_local;
  
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->m_results);
  if (bVar1) {
    logTestCase(this);
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_results);
  bVar1 = this->m_iterationCount <= (int)sVar3;
  if (bVar1) {
    logAndSetTestResult(this);
  }
  else {
    executeTest(this);
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"Unexpected error",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                    ,0x2ce);
  }
  this_local._4_4_ = (IterateResult)!bVar1;
  return this_local._4_4_;
}

Assistant:

tcu::TestCase::IterateResult StateChangeCallPerformanceCase::iterate (void)
{
	if (m_results.empty())
		logTestCase();

	if ((int)m_results.size() < m_iterationCount)
	{
		executeTest();
		GLU_EXPECT_NO_ERROR(m_renderCtx.getFunctions().getError(), "Unexpected error");
		return CONTINUE;
	}
	else
	{
		logAndSetTestResult();
		return STOP;
	}
}